

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O3

int add(char **argv)

{
  zip_t *pzVar1;
  size_t sVar2;
  long lVar3;
  char *pcVar4;
  
  pzVar1 = za;
  pcVar4 = argv[1];
  sVar2 = strlen(pcVar4);
  lVar3 = zip_source_buffer(pzVar1,pcVar4,sVar2,0);
  pzVar1 = za;
  if (lVar3 == 0) {
    add_cold_2();
  }
  else {
    pcVar4 = decode_filename(*argv);
    lVar3 = zip_file_add(pzVar1,pcVar4,lVar3,0);
    if (lVar3 != -1) {
      return 0;
    }
    add_cold_1();
  }
  return -1;
}

Assistant:

static int
add(char *argv[]) {
    zip_source_t *zs;

    if ((zs = zip_source_buffer(za, argv[1], strlen(argv[1]), 0)) == NULL) {
        fprintf(stderr, "can't create zip_source from buffer: %s\n", zip_strerror(za));
        return -1;
    }

    if (zip_file_add(za, decode_filename(argv[0]), zs, 0) == -1) {
        zip_source_free(zs);
        fprintf(stderr, "can't add file '%s': %s\n", argv[0], zip_strerror(za));
        return -1;
    }
    return 0;
}